

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void schedule_colls(void)

{
  undefined4 uVar1;
  bsc_collective_t *pbVar2;
  group_t *pgVar3;
  undefined4 uVar4;
  state_t *psVar5;
  bsc_coll_params_t *__dest;
  coll_header_t *pcVar6;
  double dVar7;
  int local_84;
  double c;
  double dStack_70;
  bsc_size_t min_alg;
  double min_cost;
  bsc_size_t n_1;
  bsc_pid_t root;
  group_t *group;
  bsc_collective_t *coll;
  coll_header_t hdr;
  bsc_coll_params_t *new_params;
  bsc_size_t new_size;
  bsc_size_t n;
  coll_request_t *ptr;
  state_t *sbsc;
  int local_10;
  bsc_size_t k;
  bsc_size_t j;
  bsc_size_t i;
  
  psVar5 = bsc();
  sbsc._4_4_ = 0;
  for (k = 0; k < psVar5->collcoa_set_size; k = k + 1) {
    _new_size = psVar5->collcoa_set[k];
    new_params._4_4_ = 0;
    psVar5->collcoa_headers[k].coll = _new_size->coll;
    psVar5->collcoa_headers[k].group = _new_size->group;
    psVar5->collcoa_headers[k].root = _new_size->root;
    while (_new_size != (coll_request_t *)0x0) {
      if (sbsc._4_4_ + new_params._4_4_ < psVar5->collcoa_param_list_size) {
        memcpy(psVar5->collcoa_param_list + (sbsc._4_4_ + new_params._4_4_),&_new_size->params,0x30)
        ;
        _new_size = _new_size->next;
        new_params._4_4_ = new_params._4_4_ + 1;
      }
      else {
        if (SBORROW4(100,psVar5->collcoa_param_list_size * 2) ==
            psVar5->collcoa_param_list_size * -2 + 100 < 0) {
          local_84 = 100;
        }
        else {
          local_84 = psVar5->collcoa_param_list_size << 1;
        }
        __dest = (bsc_coll_params_t *)calloc((long)local_84,0x30);
        if (__dest == (bsc_coll_params_t *)0x0) {
          bsp_abort("bsc_sync: insufficient memory\n");
        }
        memcpy(__dest,psVar5->collcoa_param_list,(long)psVar5->collcoa_param_list_size * 0x30);
        free(psVar5->collcoa_param_list);
        psVar5->collcoa_param_list_size = local_84;
        psVar5->collcoa_param_list = __dest;
      }
    }
    psVar5->collcoa_headers[k].n_params = new_params._4_4_;
    sbsc._4_4_ = new_params._4_4_ + sbsc._4_4_;
  }
  sbsc._4_4_ = 0;
  for (k = 0; k < psVar5->collcoa_set_size; k = k + 1) {
    pcVar6 = psVar5->collcoa_headers + k;
    pbVar2 = pcVar6->coll;
    pgVar3 = pcVar6->group;
    uVar1 = pcVar6->root;
    uVar4 = pcVar6->n_params;
    dStack_70 = INFINITY;
    c._4_4_ = 0;
    for (local_10 = 0; local_10 < pbVar2->n_algs; local_10 = local_10 + 1) {
      dVar7 = (*pbVar2->costfuncs[local_10])(pgVar3,psVar5->collcoa_param_list + sbsc._4_4_,uVar4);
      if (dVar7 < dStack_70) {
        c._4_4_ = local_10;
        dStack_70 = dVar7;
      }
    }
    (*pbVar2->algorithms[c._4_4_])
              (psVar5->current,uVar1,pgVar3,psVar5->collcoa_param_list + sbsc._4_4_,uVar4);
    sbsc._4_4_ = uVar4 + sbsc._4_4_;
  }
  hash_table_clear(&psVar5->collcoa);
  psVar5->collcoa_set_size = 0;
  return;
}

Assistant:

static void schedule_colls(void)
{
    bsc_size_t i, j, k;
    state_t * const sbsc = bsc();

    /* first copy all parameter lists from the request queue 
     * because replacing collectives with put, get requests
     * will probably cause reallocation so that our 
     * hash table structure gets invalidated */
    for ( i = 0, k = 0; i < sbsc->collcoa_set_size; ++i ) {
        coll_request_t * ptr = sbsc->collcoa_set[i];
        bsc_size_t n = 0;
        
        sbsc->collcoa_headers[i].coll = ptr->coll;
        sbsc->collcoa_headers[i].group = ptr->group;
        sbsc->collcoa_headers[i].root = ptr->root;

        /* put all parameters in an array */
        while (ptr) {
            if (sbsc->collcoa_param_list_size <= k+n ) {
                bsc_size_t new_size = MAX(100,
                        sbsc->collcoa_param_list_size*2 );
                bsc_coll_params_t * new_params = calloc( 
                        new_size, sizeof(bsc_coll_params_t) );

                if (!new_params)
                    bsp_abort("bsc_sync: insufficient memory\n");
                
                memcpy( new_params, sbsc->collcoa_param_list, 
                  sbsc->collcoa_param_list_size * sizeof(bsc_coll_params_t) ); 

                free( sbsc->collcoa_param_list );
                sbsc->collcoa_param_list_size = new_size;
                sbsc->collcoa_param_list = new_params;
            } else {
                sbsc->collcoa_param_list[k+n] = ptr->params;
                ptr = ptr->next;
                n += 1;
            }
        }
        sbsc->collcoa_headers[i].n_params = n;
        k += n;
    }

    for ( i = 0, k = 0 ; i < sbsc->collcoa_set_size; ++i ) {
        coll_header_t  hdr = sbsc->collcoa_headers[i];
        const bsc_collective_t * coll = hdr.coll;
        group_t * group = hdr.group ;
        bsc_pid_t root = hdr.root  ;
        bsc_size_t n = hdr.n_params;

        double min_cost = HUGE_VAL;
        bsc_size_t min_alg = 0;
        /* compute cheapest algorithm */
        for ( j = 0; j < coll->n_algs; ++j ) {
            double c = (*coll->costfuncs[j])(group, sbsc->collcoa_param_list + k, n);
            if (c < min_cost ) {
                min_cost = c;
                min_alg = j;
            }
        }

        /* execute cheapest algorithm */
        (*coll->algorithms[min_alg])( sbsc->current, root, group,
                sbsc->collcoa_param_list + k, n );

        k += n;
    }

    /* clear hash table for next use */
    hash_table_clear( &sbsc->collcoa );
    sbsc->collcoa_set_size = 0;
}